

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O1

void __thiscall SpanList::pushFront(SpanList *this,Span *span)

{
  Span *pSVar1;
  Span *pSVar2;
  
  pSVar1 = this->list;
  if (pSVar1 == (Span *)0x0) {
    this->list = span;
    span->next = span;
    this = (SpanList *)&span->prev;
  }
  else {
    pSVar2 = pSVar1->prev;
    pSVar2->next = span;
    span->prev = pSVar2;
    pSVar1->prev = span;
    span->next = pSVar1;
  }
  this->list = span;
  return;
}

Assistant:

void SpanList::pushFront(Span *span) {
  if (list == nullptr) {
    list = span;
    list->next = list;
    list->prev = list;
  } else {
    list->prev->next = span;
    span->prev = list->prev;
    list->prev = span;
    span->next = list;

    list = span; // 这一步非常重要
  }
}